

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O0

ThresholdState __thiscall
AbstractThresholdConditionChecker::GetStateFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  int64_t iVar10;
  reference ppCVar11;
  undefined8 in_RDX;
  CBlockIndex *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  int count;
  CBlockIndex *pindexCount;
  ThresholdState stateNext;
  ThresholdState state;
  int64_t nTimeTimeout;
  int64_t nTimeStart;
  int min_activation_height;
  int nThreshold;
  int nPeriod;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToCompute;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *in_stack_fffffffffffffee8;
  key_type *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  ThresholdState in_stack_fffffffffffffefc;
  CBlockIndex *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  int local_90;
  int local_8c;
  value_type local_88;
  ThresholdState local_7c;
  ThresholdState local_78;
  ThresholdState local_2c;
  CBlockIndex *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RDX);
  iVar4 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RDX);
  iVar5 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX);
  lVar6 = (**(code **)(*in_RDI + 8))(in_RDI,in_RDX);
  lVar7 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX);
  if (lVar6 == -1) {
    local_2c = ACTIVE;
  }
  else if (lVar6 == -2) {
    local_2c = FAILED;
  }
  else {
    local_7c = in_stack_fffffffffffffefc;
    local_10 = in_RSI;
    if (in_RSI != (CBlockIndex *)0x0) {
      local_10 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)
                            CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      local_7c = in_stack_fffffffffffffefc;
    }
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::vector
              (in_stack_fffffffffffffee8);
    while (sVar8 = std::
                   map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                   ::count((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                            *)CONCAT44(local_7c,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0
                          ), sVar8 == 0) {
      if (local_10 == (CBlockIndex *)0x0) {
        pmVar9 = std::
                 map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                 ::operator[]((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              (key_type *)in_stack_ffffffffffffff08);
        *pmVar9 = DEFINED;
        break;
      }
      iVar10 = CBlockIndex::GetMedianTimePast(in_stack_ffffffffffffff08);
      if (iVar10 < lVar6) {
        pmVar9 = std::
                 map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                 ::operator[]((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              (key_type *)in_stack_ffffffffffffff08);
        *pmVar9 = DEFINED;
        break;
      }
      std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                 CONCAT44(local_7c,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0);
      local_10 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)
                            CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    sVar8 = std::
            map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
            ::count((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                     *)CONCAT44(local_7c,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0);
    if (sVar8 == 0) {
      __assert_fail("cache.count(pindexPrev)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/versionbits.cpp"
                    ,0x32,
                    "ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex *, const Consensus::Params &, ThresholdConditionCache &) const"
                   );
    }
    pmVar9 = std::
             map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
             ::operator[]((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                          (key_type *)in_stack_ffffffffffffff08);
    local_78 = *pmVar9;
    while (bVar2 = std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::empty
                             ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                              CONCAT44(local_7c,in_stack_fffffffffffffef8)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      local_7c = local_78;
      ppCVar11 = std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::back
                           (in_stack_fffffffffffffee8);
      local_88 = *ppCVar11;
      std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::pop_back
                (in_stack_fffffffffffffee8);
      switch(local_78) {
      case DEFINED:
        iVar10 = CBlockIndex::GetMedianTimePast(in_stack_ffffffffffffff08);
        if (lVar6 <= iVar10) {
          local_7c = STARTED;
        }
        break;
      case STARTED:
        local_8c = 0;
        for (local_90 = 0; local_90 < iVar3; local_90 = local_90 + 1) {
          in_stack_ffffffffffffff17 = (**(code **)*in_RDI)(in_RDI,local_88,in_RDX);
          if ((in_stack_ffffffffffffff17 & 1) != 0) {
            local_8c = local_8c + 1;
          }
          local_88 = local_88->pprev;
        }
        if (local_8c < iVar4) {
          in_stack_ffffffffffffff08 =
               (CBlockIndex *)CBlockIndex::GetMedianTimePast(in_stack_ffffffffffffff08);
          if (lVar7 <= (long)in_stack_ffffffffffffff08) {
            local_7c = FAILED;
          }
        }
        else {
          local_7c = LOCKED_IN;
        }
        break;
      case LOCKED_IN:
        if (iVar5 <= local_88->nHeight + 1) {
          local_7c = ACTIVE;
        }
        break;
      case ACTIVE:
      case FAILED:
      }
      local_78 = local_7c;
      pmVar9 = std::
               map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
               ::operator[]((map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (key_type *)in_stack_ffffffffffffff08);
      *pmVar9 = local_7c;
    }
    local_2c = local_78;
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~vector
              ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
               CONCAT44(local_7c,in_stack_fffffffffffffef8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int nPeriod = Period(params);
    int nThreshold = Threshold(params);
    int min_activation_height = MinActivationHeight(params);
    int64_t nTimeStart = BeginTime(params);
    int64_t nTimeTimeout = EndTime(params);

    // Check if this deployment is always active.
    if (nTimeStart == Consensus::BIP9Deployment::ALWAYS_ACTIVE) {
        return ThresholdState::ACTIVE;
    }

    // Check if this deployment is never active.
    if (nTimeStart == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return ThresholdState::FAILED;
    }

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    if (pindexPrev != nullptr) {
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod));
    }

    // Walk backwards in steps of nPeriod to find a pindexPrev whose information is known
    std::vector<const CBlockIndex*> vToCompute;
    while (cache.count(pindexPrev) == 0) {
        if (pindexPrev == nullptr) {
            // The genesis block is by definition defined.
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        if (pindexPrev->GetMedianTimePast() < nTimeStart) {
            // Optimization: don't recompute down further, as we know every earlier block will be before the start time
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        vToCompute.push_back(pindexPrev);
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // At this point, cache[pindexPrev] is known
    assert(cache.count(pindexPrev));
    ThresholdState state = cache[pindexPrev];

    // Now walk forward and compute the state of descendants of pindexPrev
    while (!vToCompute.empty()) {
        ThresholdState stateNext = state;
        pindexPrev = vToCompute.back();
        vToCompute.pop_back();

        switch (state) {
            case ThresholdState::DEFINED: {
                if (pindexPrev->GetMedianTimePast() >= nTimeStart) {
                    stateNext = ThresholdState::STARTED;
                }
                break;
            }
            case ThresholdState::STARTED: {
                // We need to count
                const CBlockIndex* pindexCount = pindexPrev;
                int count = 0;
                for (int i = 0; i < nPeriod; i++) {
                    if (Condition(pindexCount, params)) {
                        count++;
                    }
                    pindexCount = pindexCount->pprev;
                }
                if (count >= nThreshold) {
                    stateNext = ThresholdState::LOCKED_IN;
                } else if (pindexPrev->GetMedianTimePast() >= nTimeTimeout) {
                    stateNext = ThresholdState::FAILED;
                }
                break;
            }
            case ThresholdState::LOCKED_IN: {
                // Progresses into ACTIVE provided activation height will have been reached.
                if (pindexPrev->nHeight + 1 >= min_activation_height) {
                    stateNext = ThresholdState::ACTIVE;
                }
                break;
            }
            case ThresholdState::FAILED:
            case ThresholdState::ACTIVE: {
                // Nothing happens, these are terminal states.
                break;
            }
        }
        cache[pindexPrev] = state = stateNext;
    }

    return state;
}